

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::
DoSimdLoadSplat<wabt::interp::Simd<unsigned_int,(unsigned_char)4>,unsigned_int>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  Simd<unsigned_int,_(unsigned_char)__x04_> value;
  Instr instr_00;
  RunResult RVar1;
  uint *__first;
  uint *__last;
  uint local_50 [2];
  Simd<unsigned_int,_(unsigned_char)__x04_> result;
  uint local_24;
  Ptr *pPStack_20;
  L val;
  Ptr *out_trap_local;
  Thread *this_local;
  
  instr_00 = instr;
  result.v[2] = instr.op.enum_;
  result.v[3] = instr.kind;
  pPStack_20 = out_trap;
  out_trap_local = (Ptr *)this;
  RVar1 = Load<unsigned_int>(this,instr_00,&local_24,out_trap);
  if (RVar1 == Ok) {
    __first = std::begin<unsigned_int,4ul>((uint (*) [4])local_50);
    __last = std::end<unsigned_int,4ul>((uint (*) [4])local_50);
    std::fill<unsigned_int*,unsigned_int>(__first,__last,&local_24);
    value.v[2] = result.v[0];
    value.v[3] = result.v[1];
    value.v[0] = local_50[0];
    value.v[1] = local_50[1];
    Push<wabt::interp::Simd<unsigned_int,(unsigned_char)4>>(this,value);
    this_local._4_4_ = Ok;
  }
  else {
    this_local._4_4_ = Trap;
  }
  return this_local._4_4_;
}

Assistant:

RunResult Thread::DoSimdLoadSplat(Instr instr, Trap::Ptr* out_trap) {
  using L = typename S::LaneType;
  L val;
  if (Load<L>(instr, &val, out_trap) != RunResult::Ok) {
    return RunResult::Trap;
  }
  S result;
  std::fill(std::begin(result.v), std::end(result.v), val);
  Push(result);
  return RunResult::Ok;
}